

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BipartiteGraph.cpp
# Opt level: O3

vector<std::deque<bool,_std::allocator<bool>_>,_std::allocator<std::deque<bool,_std::allocator<bool>_>_>_>
* BipartiteGraph::getIncidenceMatrix
            (vector<std::deque<bool,_std::allocator<bool>_>,_std::allocator<std::deque<bool,_std::allocator<bool>_>_>_>
             *__return_storage_ptr__,vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *edges1,
            vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *edges2)

{
  pointer pdVar1;
  _Elt_pointer pbVar2;
  bool bVar3;
  pointer pPVar4;
  pointer pPVar5;
  _Elt_pointer pbVar6;
  pointer pPVar7;
  pointer pPVar8;
  ulong uVar9;
  pointer pPVar10;
  _Elt_pointer pbVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  allocator_type local_93;
  allocator_type local_92;
  value_type local_91;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *local_90;
  ulong local_88;
  _Deque_base<bool,_std::allocator<bool>_> local_80;
  
  pPVar7 = (edges1->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pPVar8 = (edges1->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  local_91 = false;
  local_90 = edges1;
  std::deque<bool,_std::allocator<bool>_>::deque
            ((deque<bool,_std::allocator<bool>_> *)&local_80,
             ((long)(edges2->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(edges2->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>).
                    _M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7,&local_91,
             &local_92);
  std::
  vector<std::deque<bool,_std::allocator<bool>_>,_std::allocator<std::deque<bool,_std::allocator<bool>_>_>_>
  ::vector(__return_storage_ptr__,((long)pPVar8 - (long)pPVar7 >> 3) * -0x71c71c71c71c71c7,
           (value_type *)&local_80,&local_93);
  std::_Deque_base<bool,_std::allocator<bool>_>::~_Deque_base(&local_80);
  pPVar7 = (local_90->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pPVar8 = (local_90->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pPVar8 != pPVar7) {
    uVar13 = 0;
    pPVar4 = (edges2->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    pPVar5 = (edges2->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>)._M_impl.
             super__Vector_impl_data._M_start;
    do {
      pPVar10 = pPVar5;
      if (pPVar4 != pPVar5) {
        lVar14 = 0;
        uVar9 = 0;
        local_88 = uVar13;
        do {
          bVar3 = Bipartition::crosses
                            (&(local_90->
                              super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>).
                              _M_impl.super__Vector_impl_data._M_start[uVar13].super_Bipartition,
                             (Bipartition *)
                             ((long)&(pPVar10->super_Bipartition)._vptr_Bipartition + lVar14));
          pdVar1 = (__return_storage_ptr__->
                   super__Vector_base<std::deque<bool,_std::allocator<bool>_>,_std::allocator<std::deque<bool,_std::allocator<bool>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          pbVar6 = ((iterator *)
                   ((long)&pdVar1[uVar13].super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
                           super__Deque_impl_data + 0x10))->_M_cur;
          pbVar2 = *(_Elt_pointer *)
                    ((long)&pdVar1[uVar13].super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
                            super__Deque_impl_data + 0x18);
          pbVar11 = pbVar6 + (uVar9 - (long)pbVar2);
          if ((long)pbVar11 < 0) {
            uVar12 = (long)pbVar11 >> 9;
LAB_0013cc38:
            pbVar6 = (*(_Map_pointer *)
                       ((long)&pdVar1[uVar13].super__Deque_base<bool,_std::allocator<bool>_>._M_impl
                               .super__Deque_impl_data + 0x28))[uVar12] +
                     (long)(pbVar6 + (uVar12 * -0x200 - (long)pbVar2));
          }
          else if ((_Elt_pointer)0x1ff < pbVar11) {
            uVar12 = (ulong)pbVar11 >> 9;
            goto LAB_0013cc38;
          }
          pbVar6[uVar9] = bVar3;
          uVar9 = uVar9 + 1;
          pPVar10 = (edges2->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          pPVar5 = (edges2->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
          lVar14 = lVar14 + 0x48;
        } while (uVar9 < (ulong)(((long)pPVar5 - (long)pPVar10 >> 3) * -0x71c71c71c71c71c7));
        pPVar7 = (local_90->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        pPVar8 = (local_90->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
        uVar13 = local_88;
      }
      uVar13 = uVar13 + 1;
      pPVar4 = pPVar5;
      pPVar5 = pPVar10;
    } while (uVar13 < (ulong)(((long)pPVar8 - (long)pPVar7 >> 3) * -0x71c71c71c71c71c7));
  }
  return __return_storage_ptr__;
}

Assistant:

vector<deque<bool>> BipartiteGraph::getIncidenceMatrix(vector<PhyloTreeEdge>& edges1, vector<PhyloTreeEdge>& edges2) {
    std::vector<std::deque<bool>> incidenceMatrix(edges1.size(), std::deque<bool>(edges2.size(), false));
    for (size_t i = 0; i < edges1.size(); i++) {
        for (size_t j = 0; j < edges2.size(); j++) {
            incidenceMatrix[i][j] = edges1[i].crosses(edges2[j]);
        }
    }
    return incidenceMatrix;
}